

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::detectinterfaces(tetgenmesh *this)

{
  uint uVar1;
  memorypool *pmVar2;
  shellface **subfacearray;
  shellface *pppdVar3;
  tetgenmesh *ptVar4;
  shellface **ppppdVar5;
  int internum;
  int local_1c;
  
  if (this->b->quiet == 0) {
    puts("Detecting self-intersecting facets...");
  }
  ptVar4 = (tetgenmesh *)this->subfaces;
  subfacearray = (shellface **)
                 operator_new__(-(ulong)((ulong)ptVar4->tet2subpool >> 0x3d != 0) |
                                (long)ptVar4->tet2subpool << 3);
  memorypool::traversalinit((memorypool *)ptVar4);
  pppdVar3 = shellfacetraverse(ptVar4,this->subfaces);
  ppppdVar5 = subfacearray;
  while (pppdVar3 != (shellface *)0x0) {
    *ppppdVar5 = pppdVar3;
    pppdVar3 = shellfacetraverse(ptVar4,this->subfaces);
    ppppdVar5 = ppppdVar5 + 1;
  }
  local_1c = 0;
  interecursive(this,subfacearray,(int)this->subfaces->items,0,this->xmin,this->xmax,this->ymin,
                this->ymax,this->zmin,this->zmax,&local_1c);
  if (this->b->quiet == 0) {
    if (local_1c < 1) {
      puts("\nNo faces are intersecting.\n");
    }
    else {
      printf("\n!! Found %d pairs of faces are intersecting.\n\n");
    }
  }
  ptVar4 = (tetgenmesh *)this->subfaces;
  if (local_1c < 1) {
    memorypool::restart((memorypool *)ptVar4);
  }
  else {
    memorypool::traversalinit((memorypool *)ptVar4);
    while( true ) {
      pppdVar3 = shellfacetraverse(ptVar4,this->subfaces);
      if (pppdVar3 == (shellface *)0x0) break;
      uVar1 = *(uint *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 4);
      if ((uVar1 & 1) == 0) {
        pmVar2 = this->subfaces;
        pppdVar3[3] = (shellface)0x0;
        *pppdVar3 = (shellface)pmVar2->deaditemstack;
        pmVar2->deaditemstack = pppdVar3;
        pmVar2->items = pmVar2->items + -1;
      }
      else {
        *(uint *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 4) = uVar1 & 0xfffffffe;
      }
    }
  }
  return;
}

Assistant:

void tetgenmesh::detectinterfaces()
{
  shellface **subfacearray;
  face shloop;
  int internum;
  int i;

  if (!b->quiet) {
    printf("Detecting self-intersecting facets...\n");
  }

  // Construct a map from indices to subfaces;
  subfacearray = new shellface*[subfaces->items];
  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  i = 0;
  while (shloop.sh != (shellface *) NULL) {
    subfacearray[i] = shloop.sh;
    shloop.sh = shellfacetraverse(subfaces);
    i++;
  }

  internum = 0;
  // Recursively split the set of triangles into two sets using a cut plane
  //   parallel to x-, or, y-, or z-axis.  Stop splitting when the number
  //   of subfaces is not decreasing anymore. Do tests on the current set.
  interecursive(subfacearray, subfaces->items, 0, xmin, xmax, ymin, ymax,
                zmin, zmax, &internum);

  if (!b->quiet) {
    if (internum > 0) {
      printf("\n!! Found %d pairs of faces are intersecting.\n\n", internum);
    } else {
      printf("\nNo faces are intersecting.\n\n");
    }
  }

  if (internum > 0) {
    // Traverse all subfaces, deallocate those have not been infected (they
    //   are not intersecting faces). Uninfect those have been infected.
    //   After this loop, only intersecting faces remain.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      if (sinfected(shloop)) {
        suninfect(shloop);
      } else {
        shellfacedealloc(subfaces, shloop.sh);
      }
      shloop.sh = shellfacetraverse(subfaces);
    }
  } else {
    // Deallocate all subfaces.
    subfaces->restart();
  }
}